

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestConflictingMethodNames::Closure
          (TestConflictingMethodNames *this,RpcController *controller,DummyMessage *param_2,
          DummyMessage *param_3,Closure *done)

{
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Method Closure() not implemented.",&local_39);
  (*controller->_vptr_RpcController[6])(controller,local_38);
  std::__cxx11::string::~string(local_38);
  (*done->_vptr_Closure[2])(done);
  return;
}

Assistant:

void TestConflictingMethodNames::Closure(::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
                         const ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  controller->SetFailed("Method Closure() not implemented.");
  done->Run();
}